

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath * __thiscall
testing::internal::FilePath::RemoveTrailingPathSeparator
          (FilePath *__return_storage_ptr__,FilePath *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  _Alloc_hider local_30;
  size_type local_28;
  char local_20;
  undefined7 uStack_1f;
  undefined8 uStack_18;
  
  pcVar2 = (this->pathname_)._M_dataplus._M_p;
  sVar3 = (this->pathname_)._M_string_length;
  if ((sVar3 == 0) || (pcVar2[sVar3 - 1] != '/')) {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar3);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)this);
    paVar1 = &(__return_storage_ptr__->pathname_).field_2;
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p = (pointer)paVar1;
    if (local_30._M_p == &local_20) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_1f,local_20);
      *(undefined8 *)((long)&(__return_storage_ptr__->pathname_).field_2 + 8) = uStack_18;
    }
    else {
      (__return_storage_ptr__->pathname_)._M_dataplus._M_p = local_30._M_p;
      (__return_storage_ptr__->pathname_).field_2._M_allocated_capacity =
           CONCAT71(uStack_1f,local_20);
    }
    (__return_storage_ptr__->pathname_)._M_string_length = local_28;
    local_28 = 0;
    local_20 = '\0';
    local_30._M_p = &local_20;
    Normalize(__return_storage_ptr__);
    if (local_30._M_p != &local_20) {
      operator_delete(local_30._M_p,CONCAT71(uStack_1f,local_20) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveTrailingPathSeparator() const {
  return IsDirectory() ? FilePath(pathname_.substr(0, pathname_.length() - 1))
                       : *this;
}